

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifneuron.cxx
# Opt level: O2

void __thiscall IfNeuron::prepareNextState(IfNeuron *this)

{
  prepareNextState((IfNeuron *)&this[-1].ifneuronMembrane.eqnX0);
  return;
}

Assistant:

void IfNeuron::prepareNextState()
{
	// create next value of differential equation
	ifneuronMembrane.prepareNextState();
	stochNextStateIsPrepared = ifneuronMembrane.isNextStatePrepared();
	stochNextValue = ifneuronMembrane.getNextValue();
	
	// proceed if calculation was successful
	if (stochNextStateIsPrepared) {
		if (eventNextValue) {
			ifneuronMembrane.init();
			stochNextValue = ifneuronMembrane.getNextValue();
			eventNextValue = false;
		} else {
			if (stochNextValue>ifneuronTheta) {
				stochNextValue = ifneuronSpikeHeight;
				eventNextValue = true;
			}
		}
	}
}